

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O3

tuple<int,_int> __thiscall
libtorrent::aux::http_parser::incoming(http_parser *this,span<const_char> recv_buffer,bool *error)

{
  string *this_00;
  pointer *pppVar1;
  int iVar2;
  size_type sVar3;
  pointer pcVar4;
  iterator __position;
  _Alloc_hider _Var5;
  char cVar6;
  char cVar7;
  bool bVar8;
  anon_enum_32 aVar9;
  int iVar10;
  bool *pbVar11;
  bool *pbVar12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  bool *pbVar15;
  int iVar16;
  long lVar17;
  bool *pbVar18;
  _Alloc_hider __nptr;
  http_parser *this_01;
  uint uVar19;
  bool *in_R8;
  bool *pbVar20;
  int iVar21;
  uint uVar22;
  size_type sVar23;
  ulong uVar24;
  int iVar25;
  char *pcVar26;
  span<const_char> buf;
  char *line;
  char *end;
  string name;
  string value;
  bool *local_118;
  bool *local_100;
  char *local_f8;
  bool local_f0;
  undefined7 uStack_ef;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  bool *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_38;
  
  local_80 = (char *)recv_buffer.m_len;
  this_01 = (http_parser *)recv_buffer.m_ptr;
  this->m_recv_pos = 0;
  local_118 = (bool *)(this_01->m_recv_buffer).m_len;
  if (local_118 == error) {
    return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
  }
  (this_01->m_recv_buffer).m_ptr = local_80;
  (this_01->m_recv_buffer).m_len = (difference_type)error;
  aVar9 = this_01->m_state;
  if (aVar9 != error_state) {
    pbVar18 = (bool *)(local_80 + this_01->m_recv_pos);
    pbVar15 = error + (long)local_80;
    this_00 = &this_01->m_protocol;
    local_40 = (string *)&this_01->m_method;
    local_48 = (string *)&this_01->m_path;
    local_50 = (string *)&this_01->m_server_message;
    local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this_01->m_header;
    pbVar20 = in_R8;
    local_58 = error;
    do {
      if (aVar9 != read_header) {
        if (aVar9 != read_status) goto LAB_0020bad8;
        local_e0.first._M_dataplus._M_p._0_1_ = 10;
        pbVar11 = (bool *)::std::
                          __find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                    (pbVar18,pbVar15,&local_e0);
        if (pbVar11 == pbVar15) {
          *(int *)&this->m_recv_pos =
               (int)this->m_recv_pos + ((int)(this_01->m_recv_buffer).m_len - (int)local_118);
          return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
        }
        if (pbVar11 == pbVar18) goto LAB_0020bd5e;
        pbVar12 = pbVar11 + -1;
        if (pbVar11[-1] != true) {
          pbVar12 = pbVar11;
        }
        pbVar11 = pbVar11 + 1;
        this_01->m_recv_pos = this_01->m_recv_pos + (long)((int)pbVar11 - (int)pbVar18);
        *(int *)&this->m_recv_pos =
             (int)this->m_recv_pos +
             ((int)pbVar11 - ((int)local_118 + *(int *)&(this_01->m_recv_buffer).m_ptr));
        cVar7 = (char)pbVar12;
        local_100 = pbVar18;
        read_until_abi_cxx11_(&local_e0.first,(libtorrent *)&local_100,(char **)0x20,cVar7,pbVar20);
        ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::string::substr((ulong)&local_e0,(ulong)this_00);
        iVar10 = ::std::__cxx11::string::compare((char *)&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
        if (iVar10 == 0) {
          read_until_abi_cxx11_
                    (&local_e0.first,(libtorrent *)&local_100,(char **)0x20,cVar7,pbVar20);
          _Var5._M_p = local_e0.first._M_dataplus._M_p;
          iVar10 = atoi(local_e0.first._M_dataplus._M_p);
          this_01->m_status_code = iVar10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != &local_e0.first.field_2) {
            operator_delete(_Var5._M_p,local_e0.first.field_2._M_allocated_capacity + 1);
          }
          read_until_abi_cxx11_(&local_e0.first,(libtorrent *)&local_100,(char **)0xd,cVar7,pbVar20)
          ;
          ::std::__cxx11::string::operator=(local_50,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
            operator_delete(local_e0.first._M_dataplus._M_p,
                            local_e0.first.field_2._M_allocated_capacity + 1);
          }
          iVar10 = ::std::__cxx11::string::compare((char *)this_00);
          if (iVar10 == 0) {
            this_01->m_connection_close = true;
          }
        }
        else {
          ::std::__cxx11::string::_M_assign(local_40);
          sVar3 = (this_01->m_method)._M_string_length;
          if (sVar3 != 0) {
            pcVar4 = (this_01->m_method)._M_dataplus._M_p;
            sVar23 = 0;
            do {
              cVar6 = to_lower(pcVar4[sVar23]);
              pcVar4[sVar23] = cVar6;
              sVar23 = sVar23 + 1;
            } while (sVar3 != sVar23);
          }
          this_01->m_content_length = 0;
          (this_01->m_protocol)._M_string_length = 0;
          *(this_01->m_protocol)._M_dataplus._M_p = '\0';
          read_until_abi_cxx11_
                    (&local_e0.first,(libtorrent *)&local_100,(char **)0x20,cVar7,pbVar20);
          ::std::__cxx11::string::operator=(local_48,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
            operator_delete(local_e0.first._M_dataplus._M_p,
                            local_e0.first.field_2._M_allocated_capacity + 1);
          }
          read_until_abi_cxx11_
                    (&local_e0.first,(libtorrent *)&local_100,(char **)0x20,cVar7,pbVar20);
          ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
            operator_delete(local_e0.first._M_dataplus._M_p,
                            local_e0.first.field_2._M_allocated_capacity + 1);
          }
          this_01->m_status_code = 0;
        }
        this_01->m_state = read_header;
        local_118 = pbVar11 + -(long)local_80;
        pbVar18 = pbVar11;
      }
      local_e0.first._M_dataplus._M_p._0_1_ = 10;
      pbVar12 = (bool *)::std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (pbVar18,pbVar15,&local_e0);
      local_100 = &local_f0;
      local_f8 = (char *)0x0;
      local_f0 = false;
      pbVar11 = pbVar18;
      do {
        if ((pbVar12 == pbVar15) || (this_01->m_state != read_header)) {
LAB_0020ba7d:
          *(int *)&this->m_recv_pos =
               (int)this->m_recv_pos +
               ((int)pbVar12 - (*(int *)&(this_01->m_recv_buffer).m_ptr + (int)local_118));
          iVar10 = 0;
          pbVar18 = pbVar11;
          break;
        }
        pbVar20 = pbVar12;
        if ((pbVar11 != pbVar12) && (pbVar20 = pbVar12 + -1, pbVar12[-1] != true)) {
          pbVar20 = pbVar12;
        }
        pbVar20 = pbVar20 + -(long)pbVar11;
        ::std::__cxx11::string::replace((ulong)&local_100,0,local_f8,(ulong)pbVar11);
        pbVar18 = pbVar12 + 1;
        this_01->m_recv_pos = (int64_t)(pbVar18 + (this_01->m_recv_pos - (long)pbVar11));
        lVar13 = ::std::__cxx11::string::find('\0',0x3a);
        pbVar11 = pbVar18;
        pbVar12 = pbVar18;
        if (lVar13 == -1) {
          if (this_01->m_status_code != 100) {
            this_01->m_state = read_body;
            this_01->m_body_start_pos = (int)this_01->m_recv_pos;
            goto LAB_0020ba7d;
          }
          this_01->m_state = read_status;
          iVar10 = 4;
          break;
        }
        ::std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_100);
        sVar3 = local_a0._M_string_length;
        if (local_a0._M_string_length != 0) {
          lVar17 = CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p);
          sVar23 = 0;
          do {
            cVar7 = to_lower(*(char *)(lVar17 + sVar23));
            *(char *)(lVar17 + sVar23) = cVar7;
            sVar23 = sVar23 + 1;
          } while (sVar3 != sVar23);
        }
        pcVar26 = (char *)(lVar13 + 1);
        if (pcVar26 < local_f8) {
          do {
            if ((local_100[(long)pcVar26] != true) && (local_100[(long)pcVar26] != true)) break;
            pcVar26 = pcVar26 + 1;
          } while (local_f8 != pcVar26);
        }
        ::std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_100);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_e0,&local_a0,&local_78);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_38,&local_e0)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
          operator_delete(local_e0.second._M_dataplus._M_p,
                          local_e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
        iVar10 = ::std::__cxx11::string::compare((char *)&local_a0);
        if (iVar10 == 0) {
          uVar24 = strtoll(local_78._M_dataplus._M_p,(char **)0x0,10);
          this_01->m_content_length = uVar24;
          if (0x7ffffffffffffffe < uVar24) goto LAB_0020b9b8;
LAB_0020b905:
          local_e0.first._M_dataplus._M_p._0_1_ = 10;
          pbVar12 = (bool *)::std::
                            __find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                      (pbVar18,pbVar15,&local_e0);
          iVar10 = 0;
          bVar8 = true;
        }
        else {
          iVar10 = ::std::__cxx11::string::compare((char *)&local_a0);
          if (iVar10 == 0) {
            bVar8 = string_begins_no_case("close",local_78._M_dataplus._M_p);
            this_01->m_connection_close = bVar8;
            goto LAB_0020b905;
          }
          iVar10 = ::std::__cxx11::string::compare((char *)&local_a0);
          _Var5._M_p = local_78._M_dataplus._M_p;
          if (iVar10 != 0) {
            iVar10 = ::std::__cxx11::string::compare((char *)&local_a0);
            if (iVar10 == 0) {
              bVar8 = string_begins_no_case("chunked",local_78._M_dataplus._M_p);
              this_01->m_chunked_encoding = bVar8;
            }
            goto LAB_0020b905;
          }
          bVar8 = string_begins_no_case("bytes ",local_78._M_dataplus._M_p);
          __nptr._M_p = (pointer)(_Var5._M_p + 6);
          if (!bVar8) {
            __nptr._M_p = _Var5._M_p;
          }
          uVar24 = strtoll(__nptr._M_p,(char **)&local_e0,10);
          this_01->m_range_start = uVar24;
          if (((uVar24 < 0x7fffffffffffffff) && (local_e0.first._M_dataplus._M_p != __nptr._M_p)) &&
             (*local_e0.first._M_dataplus._M_p == '-')) {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_e0.first._M_dataplus._M_p + 1);
            uVar24 = strtoll(paVar14->_M_local_buf,(char **)&local_e0,10);
            this_01->m_range_end = uVar24;
            if (((uVar24 < 0x7fffffffffffffff) &&
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e0.first._M_dataplus._M_p != paVar14)) &&
               (this_01->m_range_start <= (long)uVar24)) {
              this_01->m_content_length = (uVar24 - this_01->m_range_start) + 1;
              goto LAB_0020b905;
            }
          }
LAB_0020b9b8:
          this_01->m_state = error_state;
          *in_R8 = true;
          iVar10 = 1;
          bVar8 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p) !=
            &local_a0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p),
                          local_a0.field_2._M_allocated_capacity + 1);
        }
      } while (bVar8);
      if (local_100 != &local_f0) {
        operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
      }
      if (iVar10 != 4) goto LAB_0020bac8;
      aVar9 = this_01->m_state;
    } while( true );
  }
LAB_0020b379:
  *in_R8 = true;
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
LAB_0020bac8:
  if (iVar10 != 0) {
    return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
  }
  aVar9 = this_01->m_state;
LAB_0020bad8:
  if (aVar9 != read_body) {
    return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
  }
  uVar24 = (long)pbVar15 - (long)pbVar18;
  uVar22 = (uint)uVar24;
  if ((this_01->m_chunked_encoding == true) && ((this_01->m_flags & 1) == 0)) {
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)this_01->m_cur_chunk_end;
    if (paVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xffffffffffffffff) {
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(long)this_01->m_body_start_pos;
      this_01->m_cur_chunk_end = (int64_t)paVar14;
    }
    iVar25 = (int)this->m_recv_pos;
    iVar10 = *(int *)((long)&this->m_recv_pos + 4);
    lVar13 = this_01->m_recv_pos;
    lVar17 = (int)uVar22 + lVar13;
    if ((((long)paVar14 <= lVar17) && (0 < (int)uVar22)) && (this_01->m_finished == false)) {
      do {
        iVar21 = (int)uVar24;
        if ((long)paVar14 - lVar13 != 0 && lVar13 <= (long)paVar14) {
          this_01->m_recv_pos = (int64_t)paVar14;
          iVar16 = (int)((long)paVar14 - lVar13);
          iVar10 = iVar10 + iVar16;
          iVar21 = iVar21 - iVar16;
        }
        buf.m_len = (long)local_58 - (long)paVar14;
        buf.m_ptr = paVar14->_M_local_buf + (long)local_80;
        bVar8 = parse_chunk_header(this_01,buf,(int64_t *)&local_100,(int *)&local_a0);
        iVar16 = (int)local_a0._M_dataplus._M_p;
        pbVar18 = local_100;
        if (bVar8) {
          if (-1 < (long)local_100) {
            lVar13 = (long)(int)local_a0._M_dataplus._M_p;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(this_01->m_cur_chunk_end + lVar13);
            if ((long)local_100 <= 0x7fffffffffffffff - (long)paVar14) {
              if (local_100 == (bool *)0x0) {
                this_01->m_cur_chunk_end = (int64_t)paVar14;
                this_01->m_finished = true;
              }
              else {
                local_e0.first._M_string_length =
                     (size_type)(paVar14->_M_local_buf + (long)local_100);
                __position._M_current =
                     (this_01->m_chunked_ranges).
                     super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_e0.first._M_dataplus._M_p = (pointer)paVar14;
                if (__position._M_current ==
                    (this_01->m_chunked_ranges).
                    super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                  _M_realloc_insert<std::pair<long,long>const&>
                            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                             &this_01->m_chunked_ranges,__position,(pair<long,_long> *)&local_e0);
                }
                else {
                  (__position._M_current)->first = (long)paVar14;
                  (__position._M_current)->second = local_e0.first._M_string_length;
                  pppVar1 = &(this_01->m_chunked_ranges).
                             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar1 = *pppVar1 + 1;
                }
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar18 + this_01->m_cur_chunk_end + lVar13);
                this_01->m_cur_chunk_end = (int64_t)paVar14;
              }
              iVar2 = this_01->m_partial_chunk_header;
              this_01->m_partial_chunk_header = 0;
              iVar16 = iVar16 - iVar2;
              goto LAB_0020bd10;
            }
          }
          *(int *)((long)&this->m_recv_pos + 4) = iVar10;
          *(int *)&this->m_recv_pos = iVar25;
LAB_0020bd5e:
          this_01->m_state = error_state;
          goto LAB_0020b379;
        }
        this_01->m_partial_chunk_header = this_01->m_partial_chunk_header + iVar21;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)this_01->m_cur_chunk_end;
        iVar16 = iVar21;
LAB_0020bd10:
        this_01->m_chunk_header_size = this_01->m_chunk_header_size + iVar16;
        lVar13 = this_01->m_recv_pos + (long)iVar16;
        this_01->m_recv_pos = lVar13;
        iVar25 = iVar25 + iVar16;
        uVar22 = iVar21 - iVar16;
        uVar24 = (ulong)uVar22;
        lVar17 = (int)uVar22 + lVar13;
      } while ((((long)paVar14 <= lVar17) && (0 < (int)uVar22)) && (this_01->m_finished == false));
    }
    *(int *)((long)&this->m_recv_pos + 4) = iVar10;
    *(int *)&this->m_recv_pos = iVar25;
    if ((int)uVar22 < 1) goto LAB_0020bb8b;
    this_01->m_recv_pos = lVar17;
    iVar10 = iVar10 + uVar22;
    lVar13 = lVar17;
  }
  else {
    lVar13 = this_01->m_recv_pos;
    lVar17 = this_01->m_content_length;
    uVar19 = ((int)lVar17 - (int)lVar13) + this_01->m_body_start_pos;
    if (((int)uVar22 + lVar13) - (long)this_01->m_body_start_pos <= lVar17) {
      uVar19 = uVar22;
    }
    if (lVar17 < 0) {
      uVar19 = uVar22;
    }
    lVar13 = lVar13 + (int)uVar19;
    this_01->m_recv_pos = lVar13;
    iVar10 = uVar19 + *(int *)((long)&this->m_recv_pos + 4);
  }
  *(int *)((long)&this->m_recv_pos + 4) = iVar10;
LAB_0020bb8b:
  if (((-1 < this_01->m_content_length) && (this_01->m_chunked_encoding == false)) &&
     (this_01->m_content_length <= lVar13 - this_01->m_body_start_pos)) {
    this_01->m_finished = true;
  }
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> http_parser::incoming(
		span<char const> recv_buffer, bool& error)
	{
		TORRENT_ASSERT(recv_buffer.size() >= m_recv_buffer.size());
		std::tuple<int, int> ret(0, 0);
		std::ptrdiff_t start_pos = m_recv_buffer.size();

		// early exit if there's nothing new in the receive buffer
		if (start_pos == recv_buffer.size()) return ret;
		m_recv_buffer = recv_buffer;

		if (m_state == error_state)
		{
			error = true;
			return ret;
		}

		char const* pos = recv_buffer.data() + m_recv_pos;

restart_response:

		if (m_state == read_status)
		{
			TORRENT_ASSERT(!m_finished);
			TORRENT_ASSERT(pos <= recv_buffer.end());
			char const* newline = std::find(pos, recv_buffer.end(), '\n');
			// if we don't have a full line yet, wait.
			if (newline == recv_buffer.end())
			{
				std::get<1>(ret) += int(m_recv_buffer.size() - start_pos);
				return ret;
			}

			if (newline == pos)
			{
				m_state = error_state;
				error = true;
				return ret;
			}

			char const* line_end = newline;
			if (pos != line_end && *(line_end - 1) == '\r') --line_end;

			char const* line = pos;
			++newline;
			TORRENT_ASSERT(newline >= pos);
			int incoming = int(newline - pos);
			m_recv_pos += incoming;
			std::get<1>(ret) += int(newline - (m_recv_buffer.data() + start_pos));
			pos = newline;

			m_protocol = read_until(line, ' ', line_end);
			if (m_protocol.substr(0, 5) == "HTTP/")
			{
				m_status_code = atoi(read_until(line, ' ', line_end).c_str());
				m_server_message = read_until(line, '\r', line_end);

				// HTTP 1.0 always closes the connection after
				// each request
				if (m_protocol == "HTTP/1.0") m_connection_close = true;
			}
			else
			{
				m_method = m_protocol;
				std::transform(m_method.begin(), m_method.end(), m_method.begin(), &to_lower);
				// the content length is assumed to be 0 for requests
				m_content_length = 0;
				m_protocol.clear();
				m_path = read_until(line, ' ', line_end);
				m_protocol = read_until(line, ' ', line_end);
				m_status_code = 0;
			}
			m_state = read_header;
			start_pos = pos - recv_buffer.data();
		}

		if (m_state == read_header)
		{
			TORRENT_ASSERT(!m_finished);
			TORRENT_ASSERT(pos <= recv_buffer.end());
			char const* newline = std::find(pos, recv_buffer.end(), '\n');
			std::string line;

			while (newline != recv_buffer.end() && m_state == read_header)
			{
				// if the LF character is preceded by a CR
				// character, don't copy it into the line string.
				char const* line_end = newline;
				if (pos != line_end && *(line_end - 1) == '\r') --line_end;
				line.assign(pos, line_end);
				++newline;
				m_recv_pos += newline - pos;
				pos = newline;

				std::string::size_type separator = line.find(':');
				if (separator == std::string::npos)
				{
					if (m_status_code == 100)
					{
						// for 100 Continue, we need to read another response header
						// before reading the body
						m_state = read_status;
						goto restart_response;
					}
					// this means we got a blank line,
					// the header is finished and the body
					// starts.
					m_state = read_body;
					// if this is a request (not a response)
					// we're done once we reach the end of the headers
//					if (!m_method.empty()) m_finished = true;
					// the HTTP header should always be < 2 GB
					TORRENT_ASSERT(m_recv_pos < std::numeric_limits<int>::max());
					m_body_start_pos = int(m_recv_pos);
					break;
				}

				std::string name = line.substr(0, separator);
				std::transform(name.begin(), name.end(), name.begin(), &to_lower);
				++separator;
				// skip whitespace
				while (separator < line.size()
					&& (line[separator] == ' ' || line[separator] == '\t'))
					++separator;
				std::string value = line.substr(separator, std::string::npos);
				m_header.insert(std::make_pair(name, value));

				if (name == "content-length")
				{
					m_content_length = std::strtoll(value.c_str(), nullptr, 10);
					if (m_content_length < 0
						|| m_content_length == std::numeric_limits<std::int64_t>::max())
					{
						m_state = error_state;
						error = true;
						return ret;
					}
				}
				else if (name == "connection")
				{
					m_connection_close = string_begins_no_case("close", value.c_str());
				}
				else if (name == "content-range")
				{
					bool success = true;
					char const* ptr = value.c_str();

					// apparently some web servers do not send the "bytes"
					// in their content-range. Don't treat it as an error
					// if we can't find it, just assume the byte counters
					// start immediately
					if (string_begins_no_case("bytes ", ptr)) ptr += 6;
					char* end;
					m_range_start = std::strtoll(ptr, &end, 10);
					if (m_range_start < 0
						|| m_range_start == std::numeric_limits<std::int64_t>::max())
					{
						m_state = error_state;
						error = true;
						return ret;
					}
					if (end == ptr) success = false;
					else if (*end != '-') success = false;
					else
					{
						ptr = end + 1;
						m_range_end = std::strtoll(ptr, &end, 10);
						if (m_range_end < 0
							|| m_range_end == std::numeric_limits<std::int64_t>::max())
						{
							m_state = error_state;
							error = true;
							return ret;
						}
						if (end == ptr) success = false;
					}

					if (!success || m_range_end < m_range_start)
					{
						m_state = error_state;
						error = true;
						return ret;
					}
					// the http range is inclusive
					m_content_length = m_range_end - m_range_start + 1;
				}
				else if (name == "transfer-encoding")
				{
					m_chunked_encoding = string_begins_no_case("chunked", value.c_str());
				}

				TORRENT_ASSERT(m_recv_pos <= int(recv_buffer.size()));
				TORRENT_ASSERT(pos <= recv_buffer.end());
				newline = std::find(pos, recv_buffer.end(), '\n');
			}
			std::get<1>(ret) += int(newline - (m_recv_buffer.data() + start_pos));
		}

		if (m_state == read_body)
		{
			int incoming = int(recv_buffer.end() - pos);

			if (m_chunked_encoding && (m_flags & dont_parse_chunks) == 0)
			{
				if (m_cur_chunk_end == -1)
					m_cur_chunk_end = m_body_start_pos;

				while (m_cur_chunk_end <= m_recv_pos + incoming && !m_finished && incoming > 0)
				{
					std::int64_t payload = m_cur_chunk_end - m_recv_pos;
					if (payload > 0)
					{
						TORRENT_ASSERT(payload < std::numeric_limits<int>::max());
						m_recv_pos += payload;
						std::get<0>(ret) += int(payload);
						incoming -= int(payload);
					}
					auto const buf = span<char const>(recv_buffer)
						.subspan(aux::numeric_cast<std::ptrdiff_t>(m_cur_chunk_end));
					std::int64_t chunk_size;
					int header_size;
					if (parse_chunk_header(buf, &chunk_size, &header_size))
					{
						if (chunk_size < 0
							|| chunk_size > std::numeric_limits<std::int64_t>::max() - m_cur_chunk_end - header_size)
						{
							m_state = error_state;
							error = true;
							return ret;
						}
						if (chunk_size > 0)
						{
							std::pair<std::int64_t, std::int64_t> chunk_range(m_cur_chunk_end + header_size
								, m_cur_chunk_end + header_size + chunk_size);
							m_chunked_ranges.push_back(chunk_range);
						}
						m_cur_chunk_end += header_size + chunk_size;
						if (chunk_size == 0)
						{
							m_finished = true;
						}
						header_size -= m_partial_chunk_header;
						m_partial_chunk_header = 0;
//						std::fprintf(stderr, "parse_chunk_header(%d, -> %" PRId64 ", -> %d) -> %d\n"
//							"  incoming = %d\n  m_recv_pos = %d\n  m_cur_chunk_end = %" PRId64 "\n"
//							"  content-length = %d\n"
//							, int(buf.size()), chunk_size, header_size, 1, incoming, int(m_recv_pos)
//							, m_cur_chunk_end, int(m_content_length));
					}
					else
					{
						m_partial_chunk_header += incoming;
						header_size = incoming;

//						std::fprintf(stderr, "parse_chunk_header(%d, -> %" PRId64 ", -> %d) -> %d\n"
//							"  incoming = %d\n  m_recv_pos = %d\n  m_cur_chunk_end = %" PRId64 "\n"
//							"  content-length = %d\n"
//							, int(buf.size()), chunk_size, header_size, 0, incoming, int(m_recv_pos)
//							, m_cur_chunk_end, int(m_content_length));
					}
					m_chunk_header_size += header_size;
					m_recv_pos += header_size;
					std::get<1>(ret) += header_size;
					incoming -= header_size;
				}
				if (incoming > 0)
				{
					m_recv_pos += incoming;
					std::get<0>(ret) += incoming;
//					incoming = 0;
				}
			}
			else
			{
				std::int64_t payload_received = m_recv_pos - m_body_start_pos + incoming;
				if (payload_received > m_content_length
					&& m_content_length >= 0)
				{
					TORRENT_ASSERT(m_content_length - m_recv_pos + m_body_start_pos
						< std::numeric_limits<int>::max());
					incoming = int(m_content_length - m_recv_pos + m_body_start_pos);
				}

				TORRENT_ASSERT(incoming >= 0);
				m_recv_pos += incoming;
				std::get<0>(ret) += incoming;
			}

			if (m_content_length >= 0
				&& !m_chunked_encoding
				&& m_recv_pos - m_body_start_pos >= m_content_length)
			{
				m_finished = true;
			}
		}
		return ret;
	}